

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatMap.c
# Opt level: O2

Sbm_Man_t * Sbm_ManAlloc(int LogN)

{
  int iVar1;
  Sbm_Man_t *pSVar2;
  sat_solver *s;
  Vec_Int_t *pVVar3;
  Vec_Wec_t *pVVar4;
  Vec_Wrd_t *pVVar5;
  word *pwVar6;
  
  pSVar2 = (Sbm_Man_t *)calloc(1,0x88);
  s = Sbm_AddCardinSolver(LogN,&pSVar2->vCardVars);
  pSVar2->pSat = s;
  pSVar2->LogN = LogN;
  iVar1 = sat_solver_nvars(s);
  pSVar2->FirstVar = iVar1;
  iVar1 = 100;
  pVVar3 = Vec_IntAlloc(100);
  pSVar2->vRoots = pVVar3;
  pVVar4 = Vec_WecAlloc(iVar1);
  pSVar2->vCuts = pVVar4;
  pVVar4 = Vec_WecAlloc(iVar1);
  pSVar2->vObjCuts = pVVar4;
  pVVar3 = Vec_IntAlloc(100);
  pSVar2->vSolCuts = pVVar3;
  pVVar3 = Vec_IntAlloc(100);
  pSVar2->vCutGates = pVVar3;
  pVVar5 = (Vec_Wrd_t *)malloc(0x10);
  pVVar5->nCap = 100;
  pVVar5->nSize = 0;
  pwVar6 = (word *)malloc(800);
  pVVar5->pArray = pwVar6;
  pSVar2->vCutAreas = pVVar5;
  pVVar3 = Vec_IntAlloc(100);
  pSVar2->vAssump = pVVar3;
  pVVar3 = Vec_IntAlloc(100);
  pSVar2->vPolar = pVVar3;
  pVVar3 = Vec_IntAlloc(100);
  pSVar2->vArrs = pVVar3;
  pVVar3 = Vec_IntAlloc(100);
  pSVar2->vReqs = pVVar3;
  pVVar3 = Vec_IntAlloc(100);
  pSVar2->vLit2Used = pVVar3;
  pVVar3 = Vec_IntAlloc(100);
  pSVar2->vDelays = pVVar3;
  pVVar3 = Vec_IntAlloc(100);
  pSVar2->vReason = pVVar3;
  return pSVar2;
}

Assistant:

Sbm_Man_t * Sbm_ManAlloc( int LogN )
{
    Sbm_Man_t * p = ABC_CALLOC( Sbm_Man_t, 1 );
    p->pSat = Sbm_AddCardinSolver( LogN, &p->vCardVars );
    p->LogN = LogN;
    p->FirstVar  = sat_solver_nvars( p->pSat );
    // window
    p->vRoots    = Vec_IntAlloc( 100 );
    p->vCuts     = Vec_WecAlloc( 1000 );
    p->vObjCuts  = Vec_WecAlloc( 1000 );
    p->vSolCuts  = Vec_IntAlloc( 100 );
    p->vCutGates = Vec_IntAlloc( 100 );
    p->vCutAreas = Vec_WrdAlloc( 100 );
    // solver
    p->vAssump   = Vec_IntAlloc( 100 );
    p->vPolar    = Vec_IntAlloc( 100 );
    // timing
    p->vArrs     = Vec_IntAlloc( 100 );
    p->vReqs     = Vec_IntAlloc( 100 );
    // internal
    p->vLit2Used = Vec_IntAlloc( 100 );
    p->vDelays   = Vec_IntAlloc( 100 );
    p->vReason   = Vec_IntAlloc( 100 );
    return p;
}